

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_get_compression(exr_const_context_t_conflict ctxt,int part_index,exr_compression_t *out)

{
  exr_priv_part_t p_Var1;
  exr_result_t eVar2;
  exr_attribute_t *peVar3;
  exr_context_t nonc;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar2 = 2;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar2 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar2;
    }
    if (out == (exr_compression_t *)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar2 = (*ctxt->print_error)(ctxt,3,"NULL output for \'%s\'","compression",ctxt->print_error);
      return eVar2;
    }
    p_Var1 = ctxt->parts[(uint)part_index];
    peVar3 = p_Var1->compression;
    if (peVar3 == (exr_attribute_t *)0x0) {
      eVar2 = 0xf;
    }
    else {
      if (peVar3->type != EXR_ATTR_COMPRESSION) {
        if (ctxt->mode == '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
          peVar3 = p_Var1->compression;
        }
        eVar2 = (*ctxt->print_error)
                          (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                           peVar3->type_name,"compression",ctxt->print_error);
        return eVar2;
      }
      *out = (uint)(peVar3->field_6).uc;
      eVar2 = 0;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_get_compression (
    exr_const_context_t ctxt, int part_index, exr_compression_t* out)
{
    REQ_ATTR_GET_IMPL (compression, uc, EXR_ATTR_COMPRESSION);
}